

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encrypt.c
# Opt level: O1

_Bool COSE_Enveloped_SetContent(HCOSE_ENVELOPED h,byte *rgb,size_t cb,cose_errback *perr)

{
  _Bool _Var1;
  void *__dest;
  COSE_Enveloped *p;
  bool bVar2;
  
  _Var1 = _COSE_IsInList(EnvelopedRoot,(COSE *)h);
  if (_Var1) {
    if (rgb != (byte *)0x0) {
      __dest = calloc(cb,1);
      *(void **)(h + 0x58) = __dest;
      bVar2 = __dest != (void *)0x0;
      if (bVar2) {
        memcpy(__dest,rgb,cb);
        *(size_t *)(h + 0x60) = cb;
        return bVar2;
      }
      if (perr == (cose_errback *)0x0) {
        return bVar2;
      }
      perr->err = COSE_ERR_INVALID_PARAMETER;
      return bVar2;
    }
    if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_INVALID_PARAMETER;
    }
  }
  else if (perr != (cose_errback *)0x0) {
    perr->err = COSE_ERR_INVALID_HANDLE;
  }
  return false;
}

Assistant:

bool COSE_Enveloped_SetContent(HCOSE_ENVELOPED h, const byte * rgb, size_t cb, cose_errback * perr)
{
	CHECK_CONDITION(IsValidEnvelopedHandle(h), COSE_ERR_INVALID_HANDLE);
	CHECK_CONDITION(rgb != NULL, COSE_ERR_INVALID_PARAMETER);

	return _COSE_Enveloped_SetContent((COSE_Enveloped *)h, rgb, cb, perr);

errorReturn:
	return false;
}